

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O0

int __thiscall re2::RE2::Set::Add(Set *this,StringPiece *pattern,string *error)

{
  undefined1 auVar1 [16];
  bool bVar2;
  RegexpOp RVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  Regexp *pRVar7;
  ulong uVar8;
  Regexp **sub_00;
  Regexp **ppRVar9;
  Regexp *pRVar10;
  Regexp *local_3d8;
  Regexp *sub_1 [2];
  int i;
  Regexp **sub;
  int nsub;
  Regexp *m;
  int n;
  LogMessage local_380;
  RegexpStatus local_200;
  Regexp *local_1e0;
  Regexp *re;
  RegexpStatus status;
  ParseFlags pf;
  LogMessage local_1a8;
  string *local_28;
  string *error_local;
  StringPiece *pattern_local;
  Set *this_local;
  
  local_28 = error;
  error_local = (string *)pattern;
  pattern_local = (StringPiece *)this;
  if ((this->compiled_ & 1U) == 0) {
    status.tmp_._0_4_ = Options::ParseFlags(&this->options_);
    RegexpStatus::RegexpStatus((RegexpStatus *)&re);
    local_1e0 = Regexp::Parse((StringPiece *)error_local,(ParseFlags)status.tmp_,(RegexpStatus *)&re
                             );
    if (local_1e0 == (Regexp *)0x0) {
      if (local_28 != (string *)0x0) {
        RegexpStatus::Text_abi_cxx11_(&local_200);
        std::__cxx11::string::operator=((string *)local_28,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
      }
      bVar2 = Options::log_errors(&this->options_);
      if (bVar2) {
        LogMessage::LogMessage
                  (&local_380,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",
                   0x2b,2);
        poVar5 = LogMessage::stream(&local_380);
        poVar5 = std::operator<<(poVar5,"Error parsing \'");
        poVar5 = operator<<(poVar5,(StringPiece *)error_local);
        poVar5 = std::operator<<(poVar5,"\': ");
        RegexpStatus::Text_abi_cxx11_((RegexpStatus *)&n);
        std::operator<<(poVar5,(string *)&n);
        std::__cxx11::string::~string((string *)&n);
        LogMessage::~LogMessage(&local_380);
      }
      this_local._4_4_ = -1;
    }
    else {
      sVar6 = std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::size(&this->re_);
      pRVar7 = Regexp::HaveMatch((int)sVar6,(ParseFlags)status.tmp_);
      RVar3 = Regexp::op(local_1e0);
      if (RVar3 == kRegexpConcat) {
        iVar4 = Regexp::nsub(local_1e0);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(iVar4 + 1);
        uVar8 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar8 = 0xffffffffffffffff;
        }
        sub_00 = (Regexp **)operator_new__(uVar8);
        for (sub_1[1]._4_4_ = 0; sub_1[1]._4_4_ < iVar4; sub_1[1]._4_4_ = sub_1[1]._4_4_ + 1) {
          ppRVar9 = Regexp::sub(local_1e0);
          pRVar10 = Regexp::Incref(ppRVar9[sub_1[1]._4_4_]);
          sub_00[sub_1[1]._4_4_] = pRVar10;
        }
        sub_00[iVar4] = pRVar7;
        Regexp::Decref(local_1e0);
        local_1e0 = Regexp::Concat(sub_00,iVar4 + 1,(ParseFlags)status.tmp_);
        if (sub_00 != (Regexp **)0x0) {
          operator_delete__(sub_00);
        }
      }
      else {
        local_3d8 = local_1e0;
        sub_1[0] = pRVar7;
        local_1e0 = Regexp::Concat(&local_3d8,2,(ParseFlags)status.tmp_);
      }
      std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::push_back(&this->re_,&local_1e0);
      this_local._4_4_ = (int)sVar6;
    }
    RegexpStatus::~RegexpStatus((RegexpStatus *)&re);
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x1e);
    poVar5 = LogMessage::stream(&local_1a8);
    std::operator<<(poVar5,"RE2::Set::Add after Compile");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int RE2::Set::Add(const StringPiece& pattern, string* error) {
  if (compiled_) {
    LOG(DFATAL) << "RE2::Set::Add after Compile";
    return -1;
  }

  Regexp::ParseFlags pf = static_cast<Regexp::ParseFlags>(
    options_.ParseFlags());

  RegexpStatus status;
  re2::Regexp* re = Regexp::Parse(pattern, pf, &status);
  if (re == NULL) {
    if (error != NULL)
      *error = status.Text();
    if (options_.log_errors())
      LOG(ERROR) << "Error parsing '" << pattern << "': " << status.Text();
    return -1;
  }

  // Concatenate with match index and push on vector.
  int n = static_cast<int>(re_.size());
  re2::Regexp* m = re2::Regexp::HaveMatch(n, pf);
  if (re->op() == kRegexpConcat) {
    int nsub = re->nsub();
    re2::Regexp** sub = new re2::Regexp*[nsub + 1];
    for (int i = 0; i < nsub; i++)
      sub[i] = re->sub()[i]->Incref();
    sub[nsub] = m;
    re->Decref();
    re = re2::Regexp::Concat(sub, nsub + 1, pf);
    delete[] sub;
  } else {
    re2::Regexp* sub[2];
    sub[0] = re;
    sub[1] = m;
    re = re2::Regexp::Concat(sub, 2, pf);
  }
  re_.push_back(re);
  return n;
}